

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easm_xfrm.c
# Opt level: O2

void easm_substpos_insn(easm_insn *insn,uint64_t val)

{
  easm_subinsn *peVar1;
  long lVar2;
  int i;
  long lVar3;
  
  for (lVar3 = 0; lVar3 < insn->subinsnsnum; lVar3 = lVar3 + 1) {
    for (lVar2 = 0; peVar1 = insn->subinsns[lVar3], lVar2 < peVar1->prefsnum; lVar2 = lVar2 + 1) {
      easm_substpos_expr(peVar1->prefs[lVar2],val);
    }
    easm_substpos_sinsn(peVar1->sinsn,val);
  }
  return;
}

Assistant:

void easm_substpos_insn(struct easm_insn *insn, uint64_t val) {
	int i, j;
	for (i = 0; i < insn->subinsnsnum; i++) {
		for (j = 0; j < insn->subinsns[i]->prefsnum; j++)
			easm_substpos_expr(insn->subinsns[i]->prefs[j], val);
		easm_substpos_sinsn(insn->subinsns[i]->sinsn, val);
	}
}